

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

node_t __thiscall lsim::Simulator::connect_pins(Simulator *this,pin_t pin_a,pin_t pin_b)

{
  node_t node_a;
  pointer puVar1;
  ulong uVar2;
  
  if (pin_a == pin_b) {
    __assert_fail("pin_a != pin_b",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x31,"node_t lsim::Simulator::connect_pins(pin_t, pin_t)");
  }
  puVar1 = (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  if (pin_a < uVar2) {
    if (pin_b < uVar2) {
      node_a = puVar1[pin_a];
      if (node_a != puVar1[pin_b]) {
        merge_nodes(this,node_a,puVar1[pin_b]);
      }
      return node_a;
    }
    __assert_fail("pin_b < m_pin_nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x33,"node_t lsim::Simulator::connect_pins(pin_t, pin_t)");
  }
  __assert_fail("pin_a < m_pin_nodes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0x32,"node_t lsim::Simulator::connect_pins(pin_t, pin_t)");
}

Assistant:

node_t Simulator::connect_pins(pin_t pin_a, pin_t pin_b) {
    assert(pin_a != pin_b);
    assert(pin_a < m_pin_nodes.size());
    assert(pin_b < m_pin_nodes.size());

    const auto node_a = m_pin_nodes[pin_a];
    const auto node_b = m_pin_nodes[pin_b];

    if (node_a == node_b) {
        // pins already connected to each other
        return node_a;
    }

    return merge_nodes(node_a, node_b);
}